

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_growstack(lua_State *L,MSize need)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  MSize n;
  ErrMsg in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (0xffe2 < *(uint *)(in_RDI + 0x38)) {
    lj_err_throw((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  uVar1 = *(int *)(in_RDI + 0x38) + in_ESI;
  if (uVar1 < 0xffdd) {
    if ((uVar1 < (uint)(*(int *)(in_RDI + 0x38) << 1)) &&
       (uVar1 = *(int *)(in_RDI + 0x38) << 1, 0xffdb < uVar1)) {
      uVar1 = 0xffdc;
    }
  }
  else {
    uVar1 = uVar1 + 0x28;
  }
  resizestack(L,need);
  if (*(uint *)(in_RDI + 0x38) < 0xffe3) {
    return;
  }
  lj_err_msg((lua_State *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffec);
}

Assistant:

void LJ_FASTCALL lj_state_growstack(lua_State *L, MSize need)
{
  MSize n;
  if (L->stacksize > LJ_STACK_MAXEX)  /* Overflow while handling overflow? */
    lj_err_throw(L, LUA_ERRERR);
  n = L->stacksize + need;
  if (n > LJ_STACK_MAX) {
    n += 2*LUA_MINSTACK;
  } else if (n < 2*L->stacksize) {
    n = 2*L->stacksize;
    if (n >= LJ_STACK_MAX)
      n = LJ_STACK_MAX;
  }
  resizestack(L, n);
  if (L->stacksize > LJ_STACK_MAXEX)
    lj_err_msg(L, LJ_ERR_STKOV);
}